

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O0

int dynet::rand0n(int n)

{
  runtime_error *this;
  int in_EDI;
  real rVar1;
  float fVar2;
  int x;
  int local_18;
  
  if (in_EDI < 1) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Integer upper bound is non-positive");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  rVar1 = rand01();
  fVar2 = rVar1 * (float)in_EDI;
  while (local_18 = (int)fVar2, in_EDI == local_18) {
    rVar1 = rand01();
    fVar2 = rVar1 * (float)in_EDI;
  }
  return local_18;
}

Assistant:

int rand0n(int n) {
  if (n <= 0) throw std::runtime_error("Integer upper bound is non-positive");
  int x = rand01() * n;
  while (n == x) { x = rand01() * n; }
  return x;
}